

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

void test_min_p(vector<float,_std::allocator<float>_> *probs,
               vector<float,_std::allocator<float>_> *probs_expected,float p)

{
  llama_sampler *plVar1;
  sampler_tester tester;
  
  sampler_tester::sampler_tester(&tester,probs,probs_expected);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x6f,"test_min_p");
  dump(&tester.cur_p);
  puts("-");
  plVar1 = (llama_sampler *)llama_sampler_init_min_p(p,1);
  sampler_tester::apply(&tester,plVar1);
  plVar1 = (llama_sampler *)llama_sampler_init_dist(0);
  sampler_tester::apply(&tester,plVar1);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x72,"test_min_p");
  dump(&tester.cur_p);
  puts("-");
  sampler_tester::check(&tester);
  sampler_tester::~sampler_tester(&tester);
  return;
}

Assistant:

static void test_min_p(const std::vector<float> & probs, const std::vector<float> & probs_expected, float p) {
    sampler_tester tester(probs, probs_expected);

    DUMP(&tester.cur_p);
    tester.apply(llama_sampler_init_min_p(p, 1));
    tester.apply(llama_sampler_init_dist (0));
    DUMP(&tester.cur_p);

    tester.check();
}